

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

bool __thiscall
bssl::anon_unknown_0::DecodeLowerHex
          (anon_unknown_0 *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,
          Span<const_char> in)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  bool bVar8;
  
  pcVar4 = in.data_;
  if (((undefined1  [16])in & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,(ulong)pcVar4 >> 1);
    pcVar3 = (char *)0x0;
    uVar5 = 0;
    while( true ) {
      bVar8 = (ulong)(*(long *)(this + 8) - *(long *)this) <= uVar5;
      if (bVar8) break;
      if ((pcVar4 <= pcVar3) || (pcVar4 <= pcVar3 + 1)) {
        abort();
      }
      cVar1 = *(char *)((long)&(out->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_start + uVar5 * 2);
      cVar2 = *(char *)((long)&(out->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_start + uVar5 * 2 + 1);
      bVar7 = cVar1 - 0x30;
      if (9 < bVar7) {
        if (5 < (byte)(cVar1 + 0x9fU)) {
          return bVar8;
        }
        bVar7 = cVar1 + 0xa9;
      }
      bVar6 = cVar2 - 0x30;
      if (9 < bVar6) {
        if (5 < (byte)(cVar2 + 0x9fU)) {
          return bVar8;
        }
        bVar6 = cVar2 + 0xa9;
      }
      *(byte *)(*(long *)this + uVar5) = bVar7 << 4 | bVar6;
      uVar5 = uVar5 + 1;
      pcVar3 = pcVar3 + 2;
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

static bool DecodeLowerHex(std::vector<uint8_t> *out,
                           bssl::Span<const char> in) {
  if (in.size() % 2 != 0) {
    return false;
  }
  out->resize(in.size() / 2);
  for (size_t i = 0; i < out->size(); i++) {
    char hi = in[2 * i], lo = in[2 * i + 1];
    uint8_t b = 0;
    if ('0' <= hi && hi <= '9') {
      b |= hi - '0';
    } else if ('a' <= hi && hi <= 'f') {
      b |= hi - 'a' + 10;
    } else {
      return false;
    }
    b <<= 4;
    if ('0' <= lo && lo <= '9') {
      b |= lo - '0';
    } else if ('a' <= lo && lo <= 'f') {
      b |= lo - 'a' + 10;
    } else {
      return false;
    }
    (*out)[i] = b;
  }
  return true;
}